

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O0

void funchook_logv(funchook_t *funchook,int set_error,char *fmt,__va_list_tag *ap)

{
  FILE *pFVar1;
  __gnuc_va_list in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  FILE *fp;
  FILE *local_28;
  
  if (funchook_debug_file[0] != '\0') {
    if (in_RDI == 0) {
      local_28 = fopen(funchook_debug_file,"a");
    }
    else if (*(long *)(in_RDI + 0xd8) == 0) {
      pFVar1 = fopen(funchook_debug_file,"a");
      *(FILE **)(in_RDI + 0xd8) = pFVar1;
      local_28 = *(FILE **)(in_RDI + 0xd8);
    }
    else {
      local_28 = *(FILE **)(in_RDI + 0xd8);
    }
    if (local_28 != (FILE *)0x0) {
      if (in_ESI != 0) {
        fputs("  ",local_28);
      }
      vfprintf(local_28,in_RDX,in_RCX);
      if (in_ESI != 0) {
        fputc(10,local_28);
      }
      if (in_RDI == 0) {
        fclose(local_28);
      }
      else {
        fflush(local_28);
      }
    }
  }
  return;
}

Assistant:

static void funchook_logv(funchook_t *funchook, int set_error, const char *fmt, va_list ap)
{
    FILE *fp;

    if (*funchook_debug_file == '\0') {
        return;
    }
    if (funchook == NULL) {
        fp = fopen(funchook_debug_file, "a");
    } else if (funchook->fp == NULL) {
        funchook->fp = fopen(funchook_debug_file, "a");
        fp = funchook->fp;
    } else {
        fp = funchook->fp;
    }
    if (fp == NULL) {
        return;
    }
    if (set_error) {
        fputs("  ", fp);
    }
    vfprintf(fp, fmt, ap);
    if (set_error) {
        fputc('\n', fp);
    }
    if (funchook == NULL) {
        fclose(fp);
    } else {
        fflush(fp);
    }
}